

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O3

int s2pred::TriageCompareDistance<double>(Vector3<double> *x,Vector3<double> *y,double r2)

{
  int iVar1;
  
  iVar1 = TriageCompareCosDistance<double>(x,y,r2);
  if ((iVar1 == 0) && (iVar1 = 0, r2 < k45Degrees)) {
    iVar1 = TriageCompareSin2Distance<double>(x,y,r2);
    return iVar1;
  }
  return iVar1;
}

Assistant:

int TriageCompareDistance(const Vector3<T>& x, const Vector3<T>& y, T r2) {
  // The Sin2 method is much more accurate for small distances, but it is only
  // valid when the actual distance and the distance limit are both less than
  // 90 degrees.  So we always start with the Cos method.
  int sign = TriageCompareCosDistance(x, y, r2);
  if (sign == 0 && r2 < k45Degrees.length2()) {
    sign = TriageCompareSin2Distance(x, y, r2);
  }
  return sign;
}